

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O2

VectorU __thiscall anurbs::HilbertCurve<2L>::point_at(HilbertCurve<2L> *this,size_t m,size_t h)

{
  uint uVar1;
  size_t sVar2;
  Scalar *pSVar3;
  ulong d;
  byte bVar4;
  uint uVar5;
  unsigned_long extraout_RDX;
  unsigned_long uVar6;
  unsigned_long extraout_RDX_00;
  ulong i;
  Index j;
  ulong uVar7;
  VectorU VVar8;
  size_t local_50;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>_>
  local_40 [16];
  
  Eigen::DenseBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<unsigned_long,1,2,1,1,2>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,Eigen::Matrix<unsigned_long,1,2,1,1,2>>>
            ((PlainObjectBase<Eigen::Matrix<unsigned_long,1,2,1,1,2>> *)this,local_40);
  d = 0;
  local_50 = 0;
  uVar6 = extraout_RDX;
  while (m = m - 1, -1 < (long)m) {
    uVar1 = (int)m * 2;
    uVar5 = (int)(h >> ((char)uVar1 + 1U & 0x3f)) * 2 & 2;
    i = (ulong)((h >> ((ulong)uVar1 & 0x3f) & 1) != 0) | (ulong)uVar5;
    sVar2 = inverse_t(local_50,d,uVar5 >> 1 ^ i);
    for (uVar7 = 0; uVar7 != 2; uVar7 = uVar7 + 1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1> *)this,
                          uVar7);
      *pSVar3 = *pSVar3 + ((ulong)((sVar2 >> (uVar7 & 0x3f) & 1) != 0) << ((byte)m & 0x3f));
    }
    uVar7 = 0;
    if (i != 0) {
      uVar7 = i - 1 >> 1 ^ i - 1 & 0xfffffffffffffffe;
    }
    bVar4 = (byte)d ^ 1;
    local_50 = local_50 ^ ((uint)(uVar7 << bVar4) | (uint)(uVar7 >> (2 - bVar4 & 0x3f))) & 3;
    sVar2 = HilbertCurve<2L>::d(i);
    d = (ulong)(~((int)sVar2 + (int)d) & 1);
    uVar6 = extraout_RDX_00;
  }
  VVar8.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
  [1] = uVar6;
  VVar8.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
  [0] = (unsigned_long)this;
  return (VectorU)VVar8.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.
                  m_storage.m_data.array;
}

Assistant:

static VectorU point_at(const size_t m, const size_t h) noexcept
    {
        // FIXME: check m

        size_t ve = 0;
        size_t vd = 0;

        VectorU p = VectorU::Zero();

        for (Index i = m - 1; i > -1; i--) {
            size_t w = 0;

            for (Index j = 0; j < TDimension; j++) {
                w += bit(h, i * TDimension + j) << j;
            }

            const size_t l = inverse_t(ve, vd, gc(w));

            for (Index j = 0; j < TDimension; j++) {
                p[j] += bit(l, j) << i;
            }

            ve = ve ^ rol(e(w), vd + 1);
            vd = (vd + d(w) + 1) % TDimension;
        }

        return p;
    }